

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameConstraints_DNSNamesFailOnInvalidIA5String_Test::
~ParseNameConstraints_DNSNamesFailOnInvalidIA5String_Test
          (ParseNameConstraints_DNSNamesFailOnInvalidIA5String_Test *this)

{
  ~ParseNameConstraints_DNSNamesFailOnInvalidIA5String_Test
            ((ParseNameConstraints_DNSNamesFailOnInvalidIA5String_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints, DNSNamesFailOnInvalidIA5String) {
  std::string a;
  ASSERT_TRUE(LoadTestNameConstraint("dnsname.pem", &a));

  size_t replace_location = a.find("permitted.example2.com");
  ASSERT_NE(std::string::npos, replace_location);
  a.replace(replace_location, 1, 1, -1);

  CertErrors errors;
  EXPECT_FALSE(
      NameConstraints::Create(StringAsBytes(a), is_critical(), &errors));
}